

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

BOOL __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::FastIdentifierContinue
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr *p,EncodedCharPtr last)

{
  utf8char_t uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  EncodedCharPtr puVar5;
  
  puVar5 = *p;
  if (puVar5 < last) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      uVar1 = *puVar5;
      if ((char)uVar1 < '\0') {
        return 0;
      }
      if ((uVar1 == '\\') &&
         (bVar3 = Js::CharClassifier::IsIdContinueFast<false>(this->charClassifier,0x5c), bVar3)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                           ,0x1bf,
                           "(currentChar != \'\\\\\' || !charClassifier->IsIdContinueFast<false>(currentChar))"
                           ,
                           "currentChar != \'\\\\\' || !charClassifier->IsIdContinueFast<false>(currentChar)"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      bVar3 = Js::CharClassifier::IsIdContinueFast<false>(this->charClassifier,(int)(char)uVar1);
      if (!bVar3) {
        return (uint)(uVar1 != '\\');
      }
      puVar5 = *p + 1;
      *p = puVar5;
    } while (puVar5 < last);
  }
  return 1;
}

Assistant:

BOOL Scanner<EncodingPolicy>::FastIdentifierContinue(EncodedCharPtr&p, EncodedCharPtr last)
{
    if (EncodingPolicy::MultiUnitEncoding)
    {
        while (p < last)
        {
            EncodedChar currentChar = *p;
            if (this->IsMultiUnitChar(currentChar))
            {
                // multi unit character, we may not have reach the end yet
                return FALSE;
            }
            Assert(currentChar != '\\' || !charClassifier->IsIdContinueFast<false>(currentChar));
            if (!charClassifier->IsIdContinueFast<false>(currentChar))
            {
                // only reach the end of the identifier if it is not the start of an escape sequence
                return currentChar != '\\';
            }
            p++;
        }
        // We have reach the end of the identifier.
        return TRUE;
    }

    // Not fast path for non multi unit encoding
    return false;
}